

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O0

void logUnsigned<unsigned_long>(void)

{
  Severity SVar1;
  cx_string<4UL> cVar2;
  SessionWriter *pSVar3;
  uint64_t _binlog_sid_v;
  unsigned_long *c;
  unsigned_long b;
  unsigned_long a;
  memory_order __b;
  memory_order __b_1;
  EventSource *in_stack_fffffffffffffe00;
  char (*in_stack_fffffffffffffe08) [12];
  unsigned_long *in_stack_fffffffffffffe10;
  unsigned_long *in_stack_fffffffffffffe18;
  __atomic_base<unsigned_long> eventSourceId;
  atomic<unsigned_long> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  Session *in_stack_fffffffffffffe30;
  data_ref in_stack_fffffffffffffe38;
  unsigned_long local_148;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  allocator local_139;
  undefined8 local_138;
  cx_string<4UL> local_12c;
  allocator local_127;
  allocator local_126;
  allocator local_125 [20];
  allocator local_111;
  undefined8 local_110;
  undefined2 local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  undefined8 local_a0;
  string local_98 [32];
  string local_78 [32];
  __atomic_base<unsigned_long> local_58;
  unsigned_long *local_50;
  unsigned_long local_48 [2];
  __atomic_base<unsigned_long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<unsigned_long> *local_28;
  Session *local_20;
  memory_order local_18;
  int local_14;
  Session *local_10;
  atomic<unsigned_long> *local_8;
  
  local_48[1] = 0x14;
  local_48[0] = 0x1e;
  local_50 = local_48;
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar1 = binlog::Session::minSeverity((Session *)0x105e74);
  if (SVar1 < 0x81) {
    local_28 = &logUnsigned<unsigned_long>::_binlog_sid;
    local_2c = 0;
    local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_38 = logUnsigned<unsigned_long>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_58 = logUnsigned<unsigned_long>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (logUnsigned<unsigned_long>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_110 = 0;
      local_108 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"main",&local_111);
      local_13d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"logUnsigned",local_125);
      local_13c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_126);
      local_13b = 1;
      local_a0 = 0x15;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"{} {} {} {}",&local_127);
      local_13a = 1;
      local_138 = 0x28;
      cVar2 = binlog::detail::
              concatenated_tags<char_const(&)[12],unsigned_long&,unsigned_long_const&,unsigned_long_const&,unsigned_long>
                        ((char (*) [12])
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                         (unsigned_long *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10,(unsigned_long *)in_stack_fffffffffffffe08);
      local_12c._data._0_4_ = cVar2._data._0_4_;
      local_12c._data[4] = cVar2._data[4];
      in_stack_fffffffffffffe38 = mserialize::cx_string<4UL>::data(&local_12c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,*in_stack_fffffffffffffe38,&local_139);
      local_13a = 0;
      local_13b = 0;
      local_13c = 0;
      local_13d = 0;
      in_stack_fffffffffffffe30 =
           (Session *)
           binlog::Session::addEventSource
                     (in_stack_fffffffffffffe30,
                      (EventSource *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      local_58._M_i = (__int_type)in_stack_fffffffffffffe30;
      binlog::EventSource::~EventSource(in_stack_fffffffffffffe00);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      std::allocator<char>::~allocator((allocator<char> *)&local_127);
      std::allocator<char>::~allocator((allocator<char> *)&local_126);
      std::allocator<char>::~allocator((allocator<char> *)local_125);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      local_8 = &logUnsigned<unsigned_long>::_binlog_sid;
      local_10 = (Session *)local_58._M_i;
      local_14 = 5;
      in_stack_fffffffffffffe20 = &logUnsigned<unsigned_long>::_binlog_sid;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10;
      if (local_14 == 3) {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe20)->_session)->
        _M_i = (__int_type)local_10;
      }
      else if (local_14 == 5) {
        LOCK();
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe20)->_session)->
        _M_i = (__int_type)local_10;
        UNLOCK();
      }
      else {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe20)->_session)->
        _M_i = (__int_type)local_10;
      }
    }
    pSVar3 = binlog::default_thread_local_writer();
    eventSourceId._M_i = local_58._M_i;
    binlog::clockNow();
    local_148 = 0x28;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[12],unsigned_long&,unsigned_long_const&,unsigned_long_const&,unsigned_long>
              ((SessionWriter *)in_stack_fffffffffffffe20,eventSourceId._M_i,(uint64_t)pSVar3,
               in_stack_fffffffffffffe08,&local_148,local_50,
               (unsigned_long *)in_stack_fffffffffffffe30,(unsigned_long *)in_stack_fffffffffffffe38
              );
  }
  return;
}

Assistant:

void logUnsigned()
{
  T a = 20;
  const T b = 30;
  const T& c = b;
  BINLOG_INFO("{} {} {} {}", a, b, c, T(40));
}